

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.h
# Opt level: O0

string * __thiscall
re2c::replaceParam<std::__cxx11::string>
          (string *__return_storage_ptr__,re2c *this,string *str,string *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ulong uVar1;
  string *psVar2;
  string local_1d8 [32];
  ulong local_1b8;
  size_type pos;
  ostringstream local_1a0 [8];
  ostringstream strValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *param_local;
  string *str_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,(string *)param);
    while( true ) {
      uVar1 = std::__cxx11::string::find((string *)this,(ulong)str);
      local_1b8 = uVar1;
      if (uVar1 == 0xffffffffffffffff) break;
      psVar2 = (string *)std::__cxx11::string::length();
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::replace((ulong)this,uVar1,psVar2);
      std::__cxx11::string::~string(local_1d8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string replaceParam (std::string str, const std::string & param, const _Ty & value)
{
	if (!param.empty ())
	{
		std::ostringstream strValue;
		strValue << value;
		std::string::size_type pos;
		while((pos = str.find(param)) != std::string::npos)
		{
			str.replace(pos, param.length(), strValue.str());
		}
	}
	return str;
}